

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O3

void fe_dct2(fe_t *fe,powspec_t *mflogspec,mfcc_t *mfcep,int htk)

{
  byte bVar1;
  uint uVar2;
  melfb_t *pmVar3;
  mfcc_t *pmVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  fVar8 = (float)(double)*mflogspec;
  *mfcep = (mfcc_t)fVar8;
  pmVar3 = fe->mel_fb;
  uVar2 = pmVar3->num_filters;
  if (1 < (long)(int)uVar2) {
    lVar5 = 1;
    do {
      fVar8 = (float)((double)fVar8 + (double)mflogspec[lVar5]);
      lVar5 = lVar5 + 1;
    } while ((int)uVar2 != lVar5);
    *mfcep = (mfcc_t)fVar8;
  }
  *mfcep = (mfcc_t)(fVar8 * (float)(&pmVar3->sqrt_inv_n)[htk != 0]);
  bVar1 = fe->num_cepstra;
  if (1 < (ulong)bVar1) {
    uVar6 = 1;
    do {
      mfcep[uVar6] = 0.0;
      if ((int)uVar2 < 1) {
        fVar8 = 0.0;
      }
      else {
        pmVar4 = pmVar3->mel_cosine[uVar6];
        fVar8 = 0.0;
        uVar7 = 0;
        do {
          fVar8 = (float)((double)(float)pmVar4[uVar7] * (double)mflogspec[uVar7] + (double)fVar8);
          mfcep[uVar6] = (mfcc_t)fVar8;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      mfcep[uVar6] = (mfcc_t)(fVar8 * (float)pmVar3->sqrt_inv_2n);
      uVar6 = uVar6 + 1;
    } while (uVar6 != bVar1);
  }
  return;
}

Assistant:

void
fe_dct2(fe_t * fe, const powspec_t * mflogspec, mfcc_t * mfcep, int htk)
{
    int32 i, j;

    /* Compute C0 separately (its basis vector is 1) to avoid
     * costly multiplications. */
    mfcep[0] = mflogspec[0];
    for (j = 1; j < fe->mel_fb->num_filters; j++)
        mfcep[0] += mflogspec[j];
    if (htk)
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_2n);
    else                        /* sqrt(1/N) = sqrt(2/N) * 1/sqrt(2) */
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_n);

    for (i = 1; i < fe->num_cepstra; ++i) {
        mfcep[i] = 0;
        for (j = 0; j < fe->mel_fb->num_filters; j++) {
            mfcep[i] += COSMUL(mflogspec[j], fe->mel_fb->mel_cosine[i][j]);
        }
        mfcep[i] = COSMUL(mfcep[i], fe->mel_fb->sqrt_inv_2n);
    }
}